

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortL.c
# Opt level: O0

void burstinsertL(TRIE *root,LIST *list,size_t scnt)

{
  uchar *puVar1;
  byte local_52;
  byte local_51;
  uint local_50;
  uchar cc;
  uint uStack_4c;
  uchar c;
  uint p;
  uint i;
  LIST *np;
  LIST *lp;
  LIST *node;
  TRIE *curr;
  TRIE *new_;
  size_t scnt_local;
  LIST *list_local;
  TRIE *root_local;
  
  for (uStack_4c = 0; uStack_4c < scnt; uStack_4c = uStack_4c + 1) {
    local_50 = 0;
    local_51 = *list[uStack_4c].word;
    node = (LIST *)root;
    while (*(int *)((long)&node[0x80].word + (ulong)local_51 * 4) < 0) {
      node = (LIST *)(&node->word)[local_51];
      local_50 = local_50 + 1;
      local_51 = list[uStack_4c].word[local_50];
    }
    list[uStack_4c].next = (strlistrec *)(&node->word)[local_51];
    (&node->word)[local_51] = (uchar *)(list + uStack_4c);
    if ((local_51 != 0) &&
       (*(int *)((long)&node[0x80].word + (ulong)local_51 * 4) =
             *(int *)((long)&node[0x80].word + (ulong)local_51 * 4) + 1,
       0x2000 < *(int *)((long)&node[0x80].word + (ulong)local_51 * 4))) {
      *(undefined4 *)((long)&node[0x80].word + (ulong)local_51 * 4) = 0xffffffff;
      puVar1 = (uchar *)calloc(1,0xc00);
      np = (LIST *)(&node->word)[local_51];
      local_52 = np->word[local_50 + 1];
      _p = np->next;
      while (np != (LIST *)0x0) {
        np->next = *(strlistrec **)(puVar1 + (ulong)local_52 * 8);
        *(LIST **)(puVar1 + (ulong)local_52 * 8) = np;
        *(int *)(puVar1 + (ulong)local_52 * 4 + 0x800) =
             *(int *)(puVar1 + (ulong)local_52 * 4 + 0x800) + 1;
        np = _p;
        if (_p != (strlistrec *)0x0) {
          local_52 = _p->word[local_50 + 1];
          _p = _p->next;
        }
      }
      (&node->word)[local_51] = puVar1;
      *(undefined4 *)((long)&node[0x80].word + (ulong)local_51 * 4) = 0xffffffff;
    }
  }
  return;
}

Assistant:

static void
burstinsertL(TRIE *root, LIST *list,  size_t scnt)
{
    TRIE	*new_;
    TRIE	*curr;
    LIST	*node;
    LIST	*lp, *np;
    unsigned int	i, p;
    unsigned char	c, cc;

    for( i=0 ; i<scnt ; i++ )
    {
        curr = root;
        node = &list[i];

        for( p=0, c=list[i].word[p] ; curr->counts[c]<0 ; curr=curr->ptrs[c], p++, c=list[i].word[p] )
            ;

        node->next = (LIST *) curr->ptrs[c];
        curr->ptrs[c] = (TRIE *) node;

        if( c=='\0' )
        {
            ;  /* leave counter alone to avoid overflow, no burst */
        }
        else
        {
            curr->counts[c]++;
            if( curr->counts[c]>THRESHOLD )  /* burst */
            {
                curr->counts[c] = -1;
                p++;
                new_ = (TRIE *) calloc(1, sizeof(TRIE));

                lp = (LIST *) curr->ptrs[c], cc = lp->word[p], np = lp->next;
                while( lp!=NULL )
                {
                    lp->next = (LIST *) new_->ptrs[cc];
                    new_->ptrs[cc] = (TRIE *) lp;
                    new_->counts[cc] ++;
                    lp = np;
                    if( lp!=NULL )
                    {
                        cc = lp->word[p];
                        np = lp->next;
                    }
                }
                curr->ptrs[c] = new_;
                curr->counts[c] = -1; /* used to traverse along the trie hierarchy                     */
                curr = new_;           /* used to burst recursive, so point curr to new                 */
                c = cc;               /* point to the character that the last string was inserted into */
            }
        }
    }
}